

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

void * utf8cpy(void *dst,void *src)

{
  long lVar1;
  char *s;
  char *d;
  
  for (lVar1 = 0; *(char *)((long)src + lVar1) != '\0'; lVar1 = lVar1 + 1) {
    *(char *)((long)dst + lVar1) = *(char *)((long)src + lVar1);
  }
  *(undefined1 *)((long)dst + lVar1) = 0;
  return dst;
}

Assistant:

void *utf8cpy(void *dst, const void *src) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  while ('\0' != *s) {
    *d++ = *s++;
  }

  // append null terminating byte
  *d = '\0';

  return dst;
}